

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnOpcode(BinaryReaderIR *this,Opcode opcode)

{
  anon_struct_3_3_4b311855_for_features_used *paVar1;
  bool *pbVar2;
  _Elt_pointer puVar3;
  _Elt_pointer pEVar4;
  _Map_pointer ppEVar5;
  Result RVar6;
  _Elt_pointer pEVar7;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar8;
  _Head_base<0UL,_wabt::CodeMetadataExpr_*,_false> _Var9;
  Opcode local_6c;
  _Head_base<0UL,_wabt::CodeMetadataExpr_*,_false> local_68;
  Info local_60;
  
  pEVar7 = (this->code_metadata_queue_).entries.
           super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_6c.enum_ = opcode.enum_;
  if (((this->code_metadata_queue_).entries.
       super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_cur != pEVar7) &&
     (pEVar7->func == this->current_func_)) {
    puVar3 = (pEVar7->func_queue).
             super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((pEVar7->func_queue).
        super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar3) {
      pEVar4 = (this->code_metadata_queue_).entries.
               super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      std::
      deque<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
      ::~deque(&pEVar7->func_queue);
      if (pEVar7 == pEVar4 + -1) {
        operator_delete((this->code_metadata_queue_).entries.
                        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first,0x1b8);
        ppEVar5 = (this->code_metadata_queue_).entries.
                  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        (this->code_metadata_queue_).entries.
        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node = ppEVar5 + 1;
        pEVar7 = ppEVar5[1];
        (this->code_metadata_queue_).entries.
        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first = pEVar7;
        (this->code_metadata_queue_).entries.
        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_last = pEVar7 + 5;
      }
      else {
        pEVar7 = (this->code_metadata_queue_).entries.
                 super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      (this->code_metadata_queue_).entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur = pEVar7;
    }
    else {
      aVar8.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset - 1;
      _Var9._M_head_impl =
           (puVar3->_M_t).
           super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
           .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl;
      if ((pEVar7->func->loc).field_1.field_1.offset +
          ((_Var9._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1.field_1
          .offset == aVar8.offset) {
        ((_Var9._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.filename._M_len =
             0;
        ((_Var9._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.filename._M_str =
             (char *)0x0;
        ((_Var9._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1.field_1.
        offset = aVar8.offset;
        _Var9._M_head_impl =
             (puVar3->_M_t).
             super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
             .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl;
        (puVar3->_M_t).
        super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>.
        _M_t.
        super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
        .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl =
             (CodeMetadataExpr *)0x0;
        std::
        deque<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
        ::pop_front(&pEVar7->func_queue);
        goto LAB_001cca8e;
      }
    }
  }
  _Var9._M_head_impl = (CodeMetadataExpr *)0x0;
LAB_001cca8e:
  if (_Var9._M_head_impl == (CodeMetadataExpr *)0x0) {
    Opcode::GetInfo(&local_60,&local_6c);
    paVar1 = &this->module_->features_used;
    paVar1->simd = (bool)(paVar1->simd | local_60.result_type.enum_ == V128);
    Opcode::GetInfo(&local_60,&local_6c);
    pbVar2 = &(this->module_->features_used).threads;
    *pbVar2 = (bool)(*pbVar2 | local_60.prefix == 0xfe);
    RVar6.enum_ = Ok;
  }
  else {
    local_68._M_head_impl = _Var9._M_head_impl;
    RVar6 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_68);
    if (local_68._M_head_impl != (CodeMetadataExpr *)0x0) {
      (*((local_68._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr._vptr_Expr[1])();
    }
  }
  return (Result)RVar6.enum_;
}

Assistant:

Result BinaryReaderIR::OnOpcode(Opcode opcode) {
  std::unique_ptr<CodeMetadataExpr> metadata =
      code_metadata_queue_.pop_match(current_func_, GetLocation().offset - 1);
  if (metadata) {
    return AppendExpr(std::move(metadata));
  }
  module_->features_used.simd |= (opcode.GetResultType() == Type::V128);
  module_->features_used.threads |= (opcode.GetPrefix() == 0xfe);
  return Result::Ok;
}